

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

op_t * get_new_temp(op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,MIR_type_t t)

{
  MIR_context_t ctx_00;
  MIR_op_t mir_op;
  reg_var_t rVar1;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  MIR_op_t local_b8;
  char *local_80;
  MIR_reg_t local_78;
  MIR_reg_t local_6c;
  char local_68 [4];
  MIR_reg_t reg;
  char reg_name [50];
  MIR_context_t ctx;
  gen_ctx_t_conflict gen_ctx;
  MIR_type_t t_local;
  c2m_ctx_t c2m_ctx_local;
  
  ctx_00 = c2m_ctx->ctx;
  if ((((t != MIR_T_I64) && (t != MIR_T_U64)) && (t != MIR_T_I32)) &&
     (((t != MIR_T_U32 && (t != MIR_T_F)) && ((t != MIR_T_D && (t != MIR_T_LD)))))) {
    __assert_fail("t == MIR_T_I64 || t == MIR_T_U64 || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_F || t == MIR_T_D || t == MIR_T_LD"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2813,"op_t get_new_temp(c2m_ctx_t, MIR_type_t)");
  }
  if (t == MIR_T_I64) {
    local_d8 = "I_%u";
  }
  else {
    if (t == MIR_T_U64) {
      local_e0 = "U_%u";
    }
    else {
      if (t == MIR_T_I32) {
        local_e8 = "i_%u";
      }
      else {
        if (t == MIR_T_U32) {
          local_f0 = "u_%u";
        }
        else {
          if (t == MIR_T_F) {
            local_f8 = "f_%u";
          }
          else {
            local_f8 = "D_%u";
            if (t == MIR_T_D) {
              local_f8 = "d_%u";
            }
          }
          local_f0 = local_f8;
        }
        local_e8 = local_f0;
      }
      local_e0 = local_e8;
    }
    local_d8 = local_e0;
  }
  c2m_ctx->gen_ctx->reg_free_mark = c2m_ctx->gen_ctx->reg_free_mark + 1;
  sprintf(local_68,local_d8);
  rVar1 = get_reg_var(c2m_ctx,t,local_68,(char *)0x0);
  local_80 = rVar1.name;
  local_78 = rVar1.reg;
  local_6c = local_78;
  MIR_new_reg_op(&local_b8,ctx_00,local_78);
  mir_op._8_8_ = local_b8._8_8_;
  mir_op.data = local_b8.data;
  mir_op.u.i = local_b8.u.i;
  mir_op.u.str.s = local_b8.u.str.s;
  mir_op.u._16_8_ = local_b8.u._16_8_;
  mir_op.u.mem.disp = local_b8.u.mem.disp;
  new_op(__return_storage_ptr__,(decl_t)0x0,mir_op);
  return __return_storage_ptr__;
}

Assistant:

static op_t get_new_temp (c2m_ctx_t c2m_ctx, MIR_type_t t) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  char reg_name[50];
  MIR_reg_t reg;

  assert (t == MIR_T_I64 || t == MIR_T_U64 || t == MIR_T_I32 || t == MIR_T_U32 || t == MIR_T_F
          || t == MIR_T_D || t == MIR_T_LD);
  sprintf (reg_name,
           t == MIR_T_I64   ? "I_%u"
           : t == MIR_T_U64 ? "U_%u"
           : t == MIR_T_I32 ? "i_%u"
           : t == MIR_T_U32 ? "u_%u"
           : t == MIR_T_F   ? "f_%u"
           : t == MIR_T_D   ? "d_%u"
                            : "D_%u",
           reg_free_mark++);
  reg = get_reg_var (c2m_ctx, t, reg_name, NULL).reg;
  return new_op (NULL, MIR_new_reg_op (ctx, reg));
}